

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::BasicOcclusionQueryTestInstance::~BasicOcclusionQueryTestInstance
          (BasicOcclusionQueryTestInstance *this)

{
  StateObjects *this_00;
  bool bVar1;
  VkDevice pVVar2;
  DeviceInterface *pDVar3;
  DeviceInterface *vk;
  VkDevice device;
  BasicOcclusionQueryTestInstance *local_10;
  BasicOcclusionQueryTestInstance *this_local;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BasicOcclusionQueryTestInstance_016696e8;
  local_10 = this;
  if ((this->m_stateObjects != (StateObjects *)0x0) &&
     (this_00 = this->m_stateObjects, this_00 != (StateObjects *)0x0)) {
    StateObjects::~StateObjects(this_00);
    operator_delete(this_00,0x100);
  }
  ::vk::Handle<(vk::HandleType)11>::Handle((Handle<(vk::HandleType)11> *)&device,0);
  bVar1 = ::vk::Handle<(vk::HandleType)11>::operator!=
                    (&this->m_queryPool,(Handle<(vk::HandleType)11> *)&device);
  if (bVar1) {
    pVVar2 = Context::getDevice((this->super_TestInstance).m_context);
    pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
    (*pDVar3->_vptr_DeviceInterface[0x1f])(pDVar3,pVVar2,(this->m_queryPool).m_internal,0);
  }
  TestInstance::~TestInstance(&this->super_TestInstance);
  return;
}

Assistant:

BasicOcclusionQueryTestInstance::~BasicOcclusionQueryTestInstance (void)
{
	if (m_stateObjects)
		delete m_stateObjects;

	if (m_queryPool != DE_NULL)
	{
		const vk::VkDevice device		= m_context.getDevice();
		const vk::DeviceInterface& vk	= m_context.getDeviceInterface();

		vk.destroyQueryPool(device, m_queryPool, /*pAllocator*/ DE_NULL);
	}
}